

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# squall_stack_operation.hpp
# Opt level: O0

shared_ptr<Foo> __thiscall
squall::detail::Fetch<std::shared_ptr<Foo>,_(squall::detail::FetchContext)0>::doit
          (Fetch<std::shared_ptr<Foo>,_(squall::detail::FetchContext)0> *this,HSQUIRRELVM vm,
          SQInteger index)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<Foo> sVar1;
  Fetch<std::shared_ptr<Foo>,_(squall::detail::FetchContext)0> *typetag;
  SQUserPointer *in_stack_ffffffffffffffd8;
  SQUserPointer r;
  SQInteger index_local;
  HSQUIRRELVM vm_local;
  
  typetag = this;
  check_argument_type<(squall::detail::FetchContext)0>(vm,index,OT_USERDATA);
  sq_getuserdata(vm,index,in_stack_ffffffffffffffd8,(SQUserPointer *)typetag);
  std::shared_ptr<Foo>::shared_ptr
            ((shared_ptr<Foo> *)this,(shared_ptr<Foo> *)*in_stack_ffffffffffffffd8);
  sVar1.super___shared_ptr<Foo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = extraout_RDX._M_pi;
  sVar1.super___shared_ptr<Foo,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)typetag;
  return (shared_ptr<Foo>)sVar1.super___shared_ptr<Foo,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

static T doit(HSQUIRRELVM vm, SQInteger index) {
        check_argument_type<FC>(vm, index, OT_USERDATA);
        SQUserPointer r;
        sq_getuserdata(vm, index, &r, NULL);
        return **((T**)r);
    }